

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpheaders.cpp
# Opt level: O0

void __thiscall
QHttpHeaders::setDateTimeValue(QHttpHeaders *this,QAnyStringView name,QDateTime *dateTime)

{
  QAnyStringView newValue;
  ulong uVar1;
  undefined8 in_RCX;
  int line;
  QByteArray *in_RDI;
  long in_FS_OFFSET;
  size_t in_stack_00000018;
  QAnyStringView in_stack_00000020;
  QByteArray *str;
  QAnyStringView *in_stack_ffffffffffffff90;
  QDateTime *in_stack_ffffffffffffffb0;
  char local_38 [48];
  long local_8;
  
  line = (int)((ulong)in_RCX >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  str = in_RDI;
  uVar1 = QDateTime::isValid();
  if ((uVar1 & 1) == 0) {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)in_stack_ffffffffffffff90,(char *)str,line,(char *)in_RDI);
    QMessageLogger::warning
              (local_38,"QHttpHeaders::setDateTimeValue: invalid QDateTime value received");
  }
  else {
    QNetworkHeadersPrivate::toHttpDate(in_stack_ffffffffffffffb0);
    QAnyStringView::QAnyStringView(in_stack_ffffffffffffff90,str);
    newValue.m_size = in_stack_00000018;
    newValue.field_0.m_data = this;
    replaceOrAppend((QHttpHeaders *)str,in_stack_00000020,newValue);
    QByteArray::~QByteArray((QByteArray *)0x1c8ca8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QHttpHeaders::setDateTimeValue(QAnyStringView name, const QDateTime &dateTime)
{
    if (!dateTime.isValid()) {
        qWarning("QHttpHeaders::setDateTimeValue: invalid QDateTime value received");
        return;
    }
    replaceOrAppend(name, QNetworkHeadersPrivate::toHttpDate(dateTime));
}